

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ReporterRegistry::registerReporter
          (ReporterRegistry *this,string *name,IReporterFactory *factory)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>
  local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  local_40.second = factory;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::IReporterFactory*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>>
              *)&this->m_factories,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void registerReporter( std::string const& name, IReporterFactory* factory ) {
            m_factories.insert( std::make_pair( name, factory ) );
        }